

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  uint uVar1;
  BaseBuilder *pBVar2;
  _func_int *p_Var3;
  BaseRAPass *this_00;
  Environment vReg;
  uint uVar4;
  Error EVar5;
  uint uVar6;
  undefined8 extraout_RAX;
  long lVar7;
  long lVar8;
  ulong uVar9;
  InstId IVar10;
  Environment vReg_00;
  RACFGBuilder *pRVar11;
  ulong in_R9;
  ulong uVar12;
  ulong unaff_R12;
  Environment *out;
  undefined1 *unaff_R15;
  byte bVar13;
  bool bVar14;
  RAWorkReg *workReg;
  Operand_ OStack_c0;
  RAWorkReg *pRStack_b0;
  Operand_ OStack_a8;
  long lStack_98;
  ulong uStack_90;
  Environment *pEStack_88;
  InvokeNode *pIStack_80;
  undefined1 *puStack_78;
  ulong uStack_70;
  byte local_59;
  Environment local_58;
  RACFGBuilder *local_50;
  BaseRAPass *local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = (ulong)(byte)invokeNode->field_0xf4;
  bVar13 = local_38 != 0;
  vReg_00 = (Environment)invokeNode;
  pRVar11 = this;
  local_50 = this;
  local_48 = (BaseRAPass *)ib;
  if ((bool)bVar13) {
    out = (Environment *)&invokeNode->field_0x11c;
    lVar8 = 4;
    uVar9 = 0;
    do {
      if (uVar9 == 0x20) {
LAB_0014b0ba:
        uStack_70 = 0x14b0bf;
        onInvoke();
LAB_0014b0bf:
        uStack_70 = 0x14b0c4;
        onInvoke();
        goto LAB_0014b0c4;
      }
      unaff_R15 = (undefined1 *)0x0;
      local_59 = bVar13;
      do {
        if (*(int *)(unaff_R15 + (long)&out->_arch) != 0) {
          if ((byte)invokeNode->field_0xf4 <= (byte)uVar9) {
            uStack_70 = 0x14b0ba;
            onInvoke();
            goto LAB_0014b0ba;
          }
          uVar4 = *(uint *)((long)invokeNode->_args->_data[0]._data +
                           (long)unaff_R15 * 4 + lVar8 + -0xc);
          if (uVar4 == 0) {
            unaff_R12 = 7;
          }
          else {
            unaff_R12 = 0;
            if ((uVar4 & 7) == 1) {
              this = *(RACFGBuilder **)pRVar11;
              uVar4 = *(int *)((long)invokeNode->_args->_data[0]._data +
                              (long)unaff_R15 * 4 + lVar8 + -8) - 0x100;
              pBVar2 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._cb;
              if (uVar4 < *(uint *)&pBVar2[1].super_BaseEmitter._logger) {
                vReg_00 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar4];
                local_58 = *(Environment *)((long)vReg_00 + 0x28);
                uVar4 = 0;
                if (local_58 == (Environment)0x0) {
                  uStack_70 = 0x14adde;
                  uVar4 = BaseRAPass::_asWorkReg
                                    ((BaseRAPass *)this,(VirtReg *)vReg_00,(RAWorkReg **)&local_58);
                  pRVar11 = local_50;
                }
              }
              else {
                uVar4 = 0x1e;
              }
              unaff_R12 = 1;
              in_R9 = in_R9 & 0xffffffff;
              if (uVar4 == 0) {
                uVar4 = *(uint *)(unaff_R15 + (long)&out->_arch);
                if ((uVar4 >> 10 & 1) == 0) {
                  if ((uVar4 >> 8 & 1) != 0) {
                    if (uVar4 < 0x20000000) {
                      bVar14 = true;
                      vReg_00 = local_58;
                      if (((*(uint *)(_archTraits + (ulong)(uVar4 >> 0x18) * 4 + 0xec) ^
                           *(uint *)((long)local_58 + 0x20)) & 0xf00) == 0) {
                        uStack_70 = 0x14ae5c;
                        this = (RACFGBuilder *)local_48;
                        local_40 = in_R9;
                        EVar5 = RAInstBuilder::addCallArg
                                          ((RAInstBuilder *)local_48,(RAWorkReg *)local_58,
                                           uVar4 >> 0x10 & 0xff);
                        bVar14 = EVar5 == 0;
                        in_R9 = local_40 & 0xffffffff;
                        pRVar11 = local_50;
                        if (!bVar14) {
                          in_R9 = (ulong)EVar5;
                        }
                      }
                      goto joined_r0x0014aee1;
                    }
                    goto LAB_0014b0bf;
                  }
                }
                else {
                  if ((*(byte *)((long)local_58 + 0x21) & 0xf) == 0) {
                    uStack_70 = 0x14aec6;
                    vReg_00 = local_58;
                    this = (RACFGBuilder *)local_48;
                    local_40 = in_R9;
                    EVar5 = RAInstBuilder::addCallArg
                                      ((RAInstBuilder *)local_48,(RAWorkReg *)local_58,
                                       uVar4 >> 0x10 & 0xff);
                    bVar14 = EVar5 == 0;
                    in_R9 = local_40 & 0xffffffff;
                    pRVar11 = local_50;
                    if (!bVar14) {
                      in_R9 = (ulong)EVar5;
                    }
                  }
                  else {
                    in_R9 = 3;
                    bVar14 = false;
                    vReg_00 = local_58;
                  }
joined_r0x0014aee1:
                  if (!bVar14) goto LAB_0014ae81;
                }
                unaff_R12 = 0;
              }
              else {
                in_R9 = (ulong)uVar4;
              }
            }
          }
LAB_0014ae81:
          if (((int)unaff_R12 != 7) && ((int)unaff_R12 != 0)) goto LAB_0014aef8;
        }
        unaff_R15 = unaff_R15 + 4;
      } while (unaff_R15 != (undefined1 *)0x10);
      unaff_R12 = 5;
LAB_0014aef8:
      if (((int)unaff_R12 != 5) && (bVar13 = local_59, (int)unaff_R12 != 0)) break;
      uVar9 = uVar9 + 1;
      bVar13 = uVar9 < local_38;
      out = out + 2;
      lVar8 = lVar8 + 0x40;
    } while (uVar9 != local_38);
  }
  if ((bVar13 & 1) == 0) {
    lVar8 = 199;
    uVar9 = 0xffffff00;
    out = &local_58;
    unaff_R15 = _archTraits;
    do {
      if (*(uint *)(&invokeNode->field_0x45 + lVar8) == 0) {
        bVar13 = 0xe;
      }
      else {
        bVar13 = 0x10;
        if (((*(uint *)(&invokeNode->field_0x45 + lVar8) & 0xff000000) != 0x16000000) &&
           (bVar13 = 0,
           (*(uint *)(&invokeNode->super_InstNodeWithOperands<4U> + lVar8 * 4) & 7) == 1)) {
          this = *(RACFGBuilder **)pRVar11;
          uVar4 = *(int *)(&invokeNode->field_0x4 + lVar8 * 4) - 0x100;
          pBVar2 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._cb;
          if (uVar4 < *(uint *)&pBVar2[1].super_BaseEmitter._logger) {
            vReg_00 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar4];
            local_58 = *(Environment *)((long)vReg_00 + 0x28);
            uVar4 = 0;
            if (local_58 == (Environment)0x0) {
              uStack_70 = 0x14afbe;
              uVar4 = BaseRAPass::_asWorkReg
                                ((BaseRAPass *)this,(VirtReg *)vReg_00,(RAWorkReg **)out);
              pRVar11 = local_50;
              unaff_R12 = in_R9;
            }
          }
          else {
            uVar4 = 0x1e;
          }
          bVar13 = 1;
          uVar12 = in_R9 & 0xffffffff;
          if (uVar4 == 0) {
            uVar4 = *(uint *)(&invokeNode->field_0x45 + lVar8);
            in_R9 = 0x19;
            if ((uVar4 >> 8 & 1) != 0) {
              if (0x1fffffff < uVar4) goto LAB_0014b0c4;
              bVar13 = 0;
              vReg_00 = local_58;
              in_R9 = uVar12;
              if (((*(uint *)(_archTraits + (ulong)(uVar4 >> 0x18) * 4 + 0xec) ^
                   *(uint *)((long)local_58 + 0x20)) & 0xf00) == 0) {
                uStack_70 = 0x14b02c;
                EVar5 = RAInstBuilder::addCallRet
                                  ((RAInstBuilder *)local_48,(RAWorkReg *)local_58,
                                   uVar4 >> 0x10 & 0xff);
                bVar13 = EVar5 != 0;
                pRVar11 = local_50;
                unaff_R12 = uVar12;
                if ((bool)bVar13) {
                  in_R9 = (ulong)EVar5;
                  unaff_R12 = in_R9;
                }
              }
            }
          }
          else {
            in_R9 = (ulong)uVar4;
          }
        }
      }
      if ((bVar13 & 0xf) != 0) goto LAB_0014b069;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0xd7);
    bVar13 = 0xe;
LAB_0014b069:
    if (bVar13 == 0xe) {
      lVar8 = *(long *)pRVar11;
      in_R9 = 0;
      lVar7 = 0;
      do {
        *(uint *)((long)(&local_48->_formatOptions + -8) + lVar7 * 4) =
             ~((uint)(-1L << (*(byte *)(lVar8 + 0x10c + lVar7) & 0x3f)) |
              *(uint *)(&invokeNode->field_0xa4 + lVar7 * 4));
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
  }
  return (Error)in_R9;
LAB_0014b0c4:
  uStack_70 = 0x14b0c9;
  onInvoke();
  p_Var3 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass[0x13];
  bVar13 = *(byte *)((long)vReg_00 + 0x12);
  ((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)->_cursor = *(BaseNode **)vReg_00;
  if (bVar13 != 0) {
    lVar7 = 0;
    lStack_98 = lVar8;
    uStack_90 = unaff_R12;
    pEStack_88 = out;
    pIStack_80 = invokeNode;
    puStack_78 = unaff_R15;
    uStack_70 = uVar9;
    do {
      if (lVar7 == 0x10) {
        onBeforeRet();
        __clang_call_terminate(extraout_RAX);
      }
      bVar14 = false;
      if ((((*(uint *)((long)((long)vReg_00 + 0x40) + lVar7 * 4) & 7) == 1) &&
          (bVar14 = false, p_Var3[lVar7 + 0xc3] == (_func_int)0x16)) &&
         (uVar4 = *(int *)((long)vReg_00 + 0x44 + lVar7 * 4) - 0x100, uVar4 < 0xfffffeff)) {
        this_00 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
        pBVar2 = (this_00->super_FuncPass).super_Pass._cb;
        if (uVar4 < *(uint *)&pBVar2[1].super_BaseEmitter._logger) {
          vReg = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar4];
          pRStack_b0 = *(RAWorkReg **)((long)vReg + 0x28);
          uVar4 = 0;
          if (pRStack_b0 == (RAWorkReg *)0x0) {
            uVar4 = BaseRAPass::_asWorkReg(this_00,(VirtReg *)vReg,&pRStack_b0);
          }
        }
        else {
          uVar4 = 0x1e;
        }
        bVar14 = true;
        if (uVar4 == 0) {
          uVar1 = *(uint *)(pRStack_b0 + 0x20);
          uVar4 = 0x19;
          if ((uVar1 & 0xf00) == 0x100) {
            OStack_a8._baseId = *(uint32_t *)(pRStack_b0 + 4);
            OStack_a8._data[0] = 0;
            OStack_a8._data[1] = 0;
            OStack_c0._signature._bits = 2;
            OStack_c0._baseId = 0;
            OStack_c0._data[0] = 0;
            OStack_c0._data[1] = 0;
            uVar4 = *(uint *)(p_Var3 + lVar7 + 0xc0);
            uVar6 = (uint)(byte)TypeUtils::_typeData[*(byte *)(*(long *)(pRStack_b0 + 8) + 0xd)];
            if ((char)uVar4 != '\0') {
              uVar6 = uVar4;
            }
            OStack_a8._signature._bits = uVar1;
            if ((char)uVar6 == '+') {
              uVar4 = BaseRAPass::useTemporaryMem
                                ((BaseRAPass *)
                                 (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass,
                                 (BaseMem *)&OStack_c0,8,4);
              if (uVar4 == 0) {
                OStack_c0._signature._bits._3_1_ = 8;
                IVar10 = 0x4c1;
                if (((BaseRAPass *)this)->field_0x292 == '\0') {
                  IVar10 = 0x1d6;
                }
                uVar4 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)
                                             ->super_BaseEmitter,IVar10,&OStack_c0,&OStack_a8);
                if (uVar4 == 0) {
                  uVar4 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass.
                                               _cb)->super_BaseEmitter,0xe2,&OStack_c0);
                  goto LAB_0014b336;
                }
              }
            }
            else {
              uVar4 = 0x19;
              if (((uVar6 & 0xff) == 0x2a) &&
                 (uVar4 = BaseRAPass::useTemporaryMem
                                    ((BaseRAPass *)
                                     (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass,
                                     (BaseMem *)&OStack_c0,4,4), uVar4 == 0)) {
                OStack_c0._signature._bits._3_1_ = 4;
                IVar10 = 0x4c5;
                if (((BaseRAPass *)this)->field_0x292 == '\0') {
                  IVar10 = 0x1d9;
                }
                uVar4 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)
                                             ->super_BaseEmitter,IVar10,&OStack_c0,&OStack_a8);
                if (uVar4 == 0) {
                  uVar4 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass.
                                               _cb)->super_BaseEmitter,0xe2,&OStack_c0);
LAB_0014b336:
                  if (uVar4 == 0) {
                    bVar14 = false;
                    uVar4 = (uint)uVar9;
                  }
                }
              }
            }
          }
        }
        uVar9 = (ulong)uVar4;
      }
      if (bVar14) {
        return (Error)uVar9;
      }
      lVar7 = lVar7 + 4;
    } while ((ulong)bVar13 * 4 != lVar7);
  }
  return 0;
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    // Not handled here...
    const Operand& op = invokeNode->ret(retIndex);
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  for (RegGroup group : RegGroupVirtValues{})
    ib._clobbered[group] = Support::lsbMask<RegMask>(_pass->_physRegCount[group]) & ~fd.preservedRegs(group);

  return kErrorOk;
}